

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void randomFunc(sqlite3_context *context,int NotUsed,sqlite3_value **NotUsed2)

{
  sqlite_int64 r;
  void *in_stack_000000f8;
  int in_stack_00000104;
  i64 in_stack_ffffffffffffffd8;
  sqlite3_context *in_stack_ffffffffffffffe0;
  
  sqlite3_randomness(in_stack_00000104,in_stack_000000f8);
  if ((long)in_stack_ffffffffffffffe0 < 0) {
    in_stack_ffffffffffffffe0 =
         (sqlite3_context *)-((ulong)in_stack_ffffffffffffffe0 & 0x7fffffffffffffff);
  }
  sqlite3_result_int64(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

static void randomFunc(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **NotUsed2
){
  sqlite_int64 r;
  UNUSED_PARAMETER2(NotUsed, NotUsed2);
  sqlite3_randomness(sizeof(r), &r);
  if( r<0 ){
    /* We need to prevent a random number of 0x8000000000000000 
    ** (or -9223372036854775808) since when you do abs() of that
    ** number of you get the same value back again.  To do this
    ** in a way that is testable, mask the sign bit off of negative
    ** values, resulting in a positive value.  Then take the 
    ** 2s complement of that positive value.  The end result can
    ** therefore be no less than -9223372036854775807.
    */
    r = -(r & LARGEST_INT64);
  }
  sqlite3_result_int64(context, r);
}